

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_open_test(player *p,loc grid)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var1 = square_isknown(cave,grid);
  if (_Var1) {
    _Var2 = square_iscloseddoor(cave,grid);
    _Var1 = true;
    if (!_Var2) {
      _Var1 = false;
      msgt(0x1b,"You see nothing there to open.");
      _Var2 = square_iscloseddoor((chunk_conflict *)p->cave,grid);
      if (_Var2) {
        square_forget(cave,grid);
        square_light_spot((chunk *)cave,grid);
        _Var1 = false;
      }
    }
  }
  else {
    _Var1 = false;
    msg("You see nothing there.");
  }
  return _Var1;
}

Assistant:

static bool do_cmd_open_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Must be a closed door */
	if (!square_iscloseddoor(cave, grid)) {
		msgt(MSG_NOTHING_TO_OPEN, "You see nothing there to open.");
		if (square_iscloseddoor(p->cave, grid)) {
			square_forget(cave, grid);
			square_light_spot(cave, grid);
		}
		return false;
	}

	return (true);
}